

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O1

uint __thiscall ON_InstanceDefinition::SizeOf(ON_InstanceDefinition *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar2 = ON_ModelComponent::SizeOf(&this->super_ON_ModelComponent);
  iVar1 = (this->m_object_uuid).m_capacity;
  uVar3 = ON_wString::SizeOf(&this->m_description);
  uVar4 = ON_wString::SizeOf(&this->m_url);
  uVar5 = ON_wString::SizeOf(&this->m_url_tag);
  uVar6 = ON_FileReference::SizeOf(&this->m_linked_file_reference);
  return uVar6 + uVar5 + uVar4 + uVar3 + uVar2 + iVar1 * 0x10 + 0x228;
}

Assistant:

unsigned int ON_InstanceDefinition::SizeOf() const
{
  unsigned int sz = sizeof(*this) - sizeof(ON_Geometry);
  sz += ON_ModelComponent::SizeOf();
  sz += this->m_object_uuid.SizeOfArray();
  sz += this->m_description.SizeOf();
  sz += this->m_url.SizeOf();
  sz += this->m_url_tag.SizeOf();
  sz += this->m_linked_file_reference.SizeOf();
  return sz;
}